

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_64x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  long lVar2;
  int flipud;
  int shift;
  int fliplr;
  __m128i in [256];
  
  piVar1 = av1_fwd_txfm_shift_ls[0x12];
  flipud = 0;
  fliplr = 0;
  if ((byte)(tx_type - 4) < 0xc) {
    lVar2 = (ulong)(byte)(tx_type - 4) * 4;
    flipud = *(int *)(&DAT_004bc89c + lVar2);
    fliplr = *(int *)(&DAT_004bc8cc + lVar2);
  }
  for (lVar2 = 0; lVar2 != 0x1000; lVar2 = lVar2 + 0x100) {
    shift = (int)*piVar1;
    load_buffer_4x4(input,(__m128i *)((long)in[0] + lVar2),4,flipud,fliplr,shift);
    load_buffer_4x4(input + 0x10,(__m128i *)((long)in[4] + lVar2),4,flipud,fliplr,shift);
    load_buffer_4x4(input + 0x20,(__m128i *)((long)in[8] + lVar2),4,flipud,fliplr,shift);
    load_buffer_4x4(input + 0x30,(__m128i *)((long)in[0xc] + lVar2),4,flipud,fliplr,shift);
    input = input + stride;
  }
  fdct16x16_sse4_1(in,(__m128i *)coeff,0xd,0x10);
  col_txfm_16x16_rounding((__m128i *)coeff,-(int)piVar1[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x100),-(int)piVar1[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x200),-(int)piVar1[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x300),-(int)piVar1[1]);
  transpose_8nx8n((__m128i *)coeff,in,0x40,0x10);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    av1_fdct64_sse4_1((__m128i *)((long)in[0] + lVar2),(__m128i *)((long)coeff + lVar2),'\f',4,4);
  }
  memset((__m128i *)(coeff + 0x200),0,0x800);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X16];
  const int txw_idx = get_txw_idx(TX_64X16);
  const int txh_idx = get_txh_idx(TX_64X16);
  const int txfm_size_col = tx_size_wide[TX_64X16];
  const int txfm_size_row = tx_size_high[TX_64X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  for (int i = 0; i < txfm_size_row; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
  }

  fdct16x16_sse4_1(in, outcoeff128, bitcol, txfm_size_row);
  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);
  for (int i = 0; i < 4; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitrow, 4, 4);
  }
  memset(coeff + txfm_size_row * 32, 0, txfm_size_row * 32 * sizeof(*coeff));
  (void)bd;
}